

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019d0e0 = 0x2d2d2d2d2d2d2d;
    uRam000000000019d0e7._0_1_ = '-';
    uRam000000000019d0e7._1_1_ = '-';
    uRam000000000019d0e7._2_1_ = '-';
    uRam000000000019d0e7._3_1_ = '-';
    uRam000000000019d0e7._4_1_ = '-';
    uRam000000000019d0e7._5_1_ = '-';
    uRam000000000019d0e7._6_1_ = '-';
    uRam000000000019d0e7._7_1_ = '-';
    DAT_0019d0d0 = '-';
    DAT_0019d0d0_1._0_1_ = '-';
    DAT_0019d0d0_1._1_1_ = '-';
    DAT_0019d0d0_1._2_1_ = '-';
    DAT_0019d0d0_1._3_1_ = '-';
    DAT_0019d0d0_1._4_1_ = '-';
    DAT_0019d0d0_1._5_1_ = '-';
    DAT_0019d0d0_1._6_1_ = '-';
    uRam000000000019d0d8 = 0x2d2d2d2d2d2d2d;
    DAT_0019d0df = 0x2d;
    DAT_0019d0c0 = '-';
    DAT_0019d0c0_1._0_1_ = '-';
    DAT_0019d0c0_1._1_1_ = '-';
    DAT_0019d0c0_1._2_1_ = '-';
    DAT_0019d0c0_1._3_1_ = '-';
    DAT_0019d0c0_1._4_1_ = '-';
    DAT_0019d0c0_1._5_1_ = '-';
    DAT_0019d0c0_1._6_1_ = '-';
    uRam000000000019d0c8._0_1_ = '-';
    uRam000000000019d0c8._1_1_ = '-';
    uRam000000000019d0c8._2_1_ = '-';
    uRam000000000019d0c8._3_1_ = '-';
    uRam000000000019d0c8._4_1_ = '-';
    uRam000000000019d0c8._5_1_ = '-';
    uRam000000000019d0c8._6_1_ = '-';
    uRam000000000019d0c8._7_1_ = '-';
    DAT_0019d0b0 = '-';
    DAT_0019d0b0_1._0_1_ = '-';
    DAT_0019d0b0_1._1_1_ = '-';
    DAT_0019d0b0_1._2_1_ = '-';
    DAT_0019d0b0_1._3_1_ = '-';
    DAT_0019d0b0_1._4_1_ = '-';
    DAT_0019d0b0_1._5_1_ = '-';
    DAT_0019d0b0_1._6_1_ = '-';
    uRam000000000019d0b8._0_1_ = '-';
    uRam000000000019d0b8._1_1_ = '-';
    uRam000000000019d0b8._2_1_ = '-';
    uRam000000000019d0b8._3_1_ = '-';
    uRam000000000019d0b8._4_1_ = '-';
    uRam000000000019d0b8._5_1_ = '-';
    uRam000000000019d0b8._6_1_ = '-';
    uRam000000000019d0b8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019d0a8._0_1_ = '-';
    uRam000000000019d0a8._1_1_ = '-';
    uRam000000000019d0a8._2_1_ = '-';
    uRam000000000019d0a8._3_1_ = '-';
    uRam000000000019d0a8._4_1_ = '-';
    uRam000000000019d0a8._5_1_ = '-';
    uRam000000000019d0a8._6_1_ = '-';
    uRam000000000019d0a8._7_1_ = '-';
    DAT_0019d0ef = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}